

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImGuiSettingsHandler * ImGui::FindSettingsHandler(char *type_name)

{
  ImGuiContext *pIVar1;
  ImU32 IVar2;
  ImGuiSettingsHandler *pIVar3;
  void *in_RDI;
  int handler_n;
  ImGuiID type_hash;
  ImGuiContext *g;
  int local_20;
  
  pIVar1 = GImGui;
  IVar2 = ImHash(in_RDI,0,0);
  local_20 = 0;
  while( true ) {
    if ((pIVar1->SettingsHandlers).Size <= local_20) {
      return (ImGuiSettingsHandler *)0x0;
    }
    pIVar3 = ImVector<ImGuiSettingsHandler>::operator[](&pIVar1->SettingsHandlers,local_20);
    if (pIVar3->TypeHash == IVar2) break;
    local_20 = local_20 + 1;
  }
  pIVar3 = ImVector<ImGuiSettingsHandler>::operator[](&pIVar1->SettingsHandlers,local_20);
  return pIVar3;
}

Assistant:

ImGuiSettingsHandler* ImGui::FindSettingsHandler(const char* type_name)
{
    ImGuiContext& g = *GImGui;
    const ImGuiID type_hash = ImHash(type_name, 0, 0);
    for (int handler_n = 0; handler_n < g.SettingsHandlers.Size; handler_n++)
        if (g.SettingsHandlers[handler_n].TypeHash == type_hash)
            return &g.SettingsHandlers[handler_n];
    return NULL;
}